

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDsd.c
# Opt level: O3

DdNode * Extra_bddComputeSum(DdManager *dd,DdNode **pbCubes,int nCubes)

{
  ulong uVar1;
  DdNode *f;
  DdNode *n;
  
  n = (DdNode *)((ulong)dd->one ^ 1);
  Cudd_Ref(n);
  if (0 < nCubes) {
    uVar1 = 0;
    f = n;
    do {
      n = Cudd_bddOr(dd,f,pbCubes[uVar1]);
      Cudd_Ref(n);
      Cudd_RecursiveDeref(dd,f);
      uVar1 = uVar1 + 1;
      f = n;
    } while ((uint)nCubes != uVar1);
  }
  Cudd_Deref(n);
  return n;
}

Assistant:

DdNode * Extra_bddComputeSum( DdManager * dd, DdNode ** pbCubes, int nCubes )
{
    DdNode * bRes, * bTemp;
    int i;
    bRes = b0; Cudd_Ref( bRes );
    for ( i = 0; i < nCubes; i++ )
    {
        bRes = Cudd_bddOr( dd, bTemp = bRes, pbCubes[i] );  Cudd_Ref( bRes );
        Cudd_RecursiveDeref( dd, bTemp );
    }
    Cudd_Deref( bRes );
    return bRes;
}